

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  options option_00;
  int iVar1;
  times *ptVar2;
  confirm *pcVar3;
  tms *__buffer;
  int in_R8D;
  options option;
  texts in;
  count count_;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  _Alloc_hider local_180;
  size_t local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  pointer local_160;
  pointer pbStack_158;
  pointer local_150;
  undefined8 uStack_148;
  tests local_138;
  vector<lest::test,_std::allocator<lest::test>_> local_120;
  undefined1 local_108 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_f0;
  tests local_d8;
  vector<lest::test,_std::allocator<lest::test>_> local_c0;
  tests local_a8;
  vector<lest::test,_std::allocator<lest::test>_> local_90;
  tests local_78;
  vector<lest::test,_std::allocator<lest::test>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  Tie<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  
  option.lexical = false;
  option.random = false;
  option.verbose = false;
  option.version = false;
  option.repeat = 1;
  option.help = false;
  option.abort = false;
  option.count = false;
  option.list = false;
  option.tags = false;
  option.time = false;
  option.pass = false;
  option.zen = false;
  option.seed = 0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,arguments);
  split_arguments((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&count_,&local_48);
  local_30.first = &option;
  local_30.second = &in;
  Tie<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_30,
              (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&count_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_198 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (option.lexical == true) {
    sort(specification);
  }
  if (option.random == true) {
    option_00.lexical = option.lexical;
    option_00.random = option.random;
    option_00.verbose = option.verbose;
    option_00.version = option.version;
    option_00.repeat = option.repeat;
    option_00.help = option.help;
    option_00.abort = option.abort;
    option_00.count = option.count;
    option_00.list = option.list;
    option_00.tags = option.tags;
    option_00.time = option.time;
    option_00.pass = option.pass;
    option_00.zen = option.zen;
    option_00.seed = option.seed;
    shuffle(specification,option_00);
  }
  if (option.help == true) {
    iVar1 = usage(os);
  }
  else if (option.version == true) {
    iVar1 = version(os);
  }
  else {
    if (option.count == true) {
      count_._8_8_ = count_._8_8_ & 0xffffffff00000000;
      count_.super_action.os = os;
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_60,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_78,&in);
      for_test<lest::count>((lest *)&local_60,&local_78,(texts *)&count_,(count *)0x1,in_R8D);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
      std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_60);
      count::~count(&count_);
    }
    else if (option.list == true) {
      count_.super_action.os = os;
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_90,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_a8,&in);
      for_test<lest::print>((lest *)&local_90,&local_a8,(texts *)&count_,(print *)0x1,in_R8D);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_90);
    }
    else {
      if (option.tags != true) {
        if (option.time == true) {
          times::times((times *)&count_,(tms *)os);
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_f0,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_108,&in);
          __buffer = (tms *)local_108;
          ptVar2 = for_test<lest::times>
                             ((lest *)&local_f0,(tests *)__buffer,(texts *)&count_,(times *)0x1,
                              in_R8D);
          iVar1 = ptVar2->failures;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_f0);
          times::~times((times *)&count_,__buffer);
        }
        else {
          local_180._M_p = (pointer)&local_170;
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_188._4_4_,option.seed);
          local_198[0] = option.help;
          local_198[1] = option.abort;
          local_198[2] = option.count;
          local_198[3] = option.list;
          local_198[4] = option.tags;
          local_198[5] = option.time;
          local_198[6] = option.pass;
          local_198[7] = option.zen;
          local_198[8] = option.lexical;
          local_198[9] = option.random;
          local_198[10] = option.verbose;
          local_198[0xb] = option.version;
          local_198._12_4_ = option.repeat;
          local_178 = 0;
          local_170._M_local_buf[0] = '\0';
          local_160 = (pointer)0x0;
          pbStack_158 = (pointer)0x0;
          local_150 = (pointer)0x0;
          uStack_148._0_4_ = 0;
          uStack_148._4_4_ = 0;
          count_.super_action.os = os;
          count_._8_8_ = os;
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_120,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_138,&in);
          pcVar3 = for_test<lest::confirm>
                             ((lest *)&local_120,&local_138,(texts *)&count_,
                              (confirm *)((ulong)option._8_8_ >> 0x20),in_R8D);
          iVar1 = pcVar3->failures;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_138);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_120);
          confirm::~confirm((confirm *)&count_);
        }
        goto LAB_00108434;
      }
      local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198;
      local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
      local_198._8_8_ = (pointer)0x0;
      local_178 = 0;
      count_.super_action.os = os;
      local_180._M_p = (pointer)local_188;
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_c0,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d8,&in);
      for_test<lest::ptags>((lest *)&local_c0,&local_d8,(texts *)&count_,(ptags *)0x1,in_R8D);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_c0);
      ptags::~ptags((ptags *)&count_);
    }
    iVar1 = 0;
  }
LAB_00108434:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in);
  return iVar1;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage  ( os ); }
        if ( option.version ) { return version( os ); }
        if ( option.count   ) { count count_( os         ); return for_test( specification, in, count_ ); }
        if ( option.list    ) { print print_( os         ); return for_test( specification, in, print_ ); }
        if ( option.tags    ) { ptags ptags_( os         ); return for_test( specification, in, ptags_ ); }
        if ( option.time    ) { times times_( os, option ); return for_test( specification, in, times_ ); }

        { confirm confirm_( os, option ); return for_test( specification, in, confirm_, option.repeat ); }
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}